

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_spec.cpp
# Opt level: O3

void DWallLightTransfer::DoTransfer(short lightlevel,int target,BYTE flags)

{
  line_t_conflict *plVar1;
  uint uVar2;
  FLineIdIterator itr;
  FLineIdIterator local_28;
  
  local_28.start = tagManager.IDHashFirst[target & 0xff];
  local_28.searchtag = target;
  uVar2 = FLineIdIterator::Next(&local_28);
  plVar1 = lines;
  while (-1 < (int)uVar2) {
    lines = plVar1;
    if (((flags & 1) != 0) && (plVar1[uVar2].sidedef[0] != (side_t *)0x0)) {
      plVar1[uVar2].sidedef[0]->Light = lightlevel;
    }
    if (((flags & 2) != 0) && (plVar1[uVar2].sidedef[1] != (side_t *)0x0)) {
      plVar1[uVar2].sidedef[1]->Light = lightlevel;
    }
    uVar2 = FLineIdIterator::Next(&local_28);
    plVar1 = lines;
  }
  lines = plVar1;
  return;
}

Assistant:

void DWallLightTransfer::DoTransfer (short lightlevel, int target, BYTE flags)
{
	int linenum;

	FLineIdIterator itr(target);
	while ((linenum = itr.Next()) >= 0)
	{
		line_t *line = &lines[linenum];

		if (flags & WLF_SIDE1 && line->sidedef[0] != NULL)
		{
			line->sidedef[0]->SetLight(lightlevel);
		}

		if (flags & WLF_SIDE2 && line->sidedef[1] != NULL)
		{
			line->sidedef[1]->SetLight(lightlevel);
		}
	}
}